

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

void __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::initialize
          (InputParameter<0UL,_ruckig::StandardVector> *this)

{
  reference pvVar1;
  double dVar2;
  reference local_28;
  ulong local_18;
  size_t dof;
  InputParameter<0UL,_ruckig::StandardVector> *this_local;
  
  dof = (size_t)this;
  for (local_18 = 0; local_18 < this->degrees_of_freedom; local_18 = local_18 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->current_velocity,local_18);
    *pvVar1 = 0.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->current_acceleration,local_18);
    *pvVar1 = 0.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->target_velocity,local_18);
    *pvVar1 = 0.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->target_acceleration,local_18);
    *pvVar1 = 0.0;
    dVar2 = std::numeric_limits<double>::infinity();
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->max_acceleration,local_18);
    *pvVar1 = dVar2;
    dVar2 = std::numeric_limits<double>::infinity();
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&this->max_jerk,local_18);
    *pvVar1 = dVar2;
    local_28 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->enabled,local_18);
    std::_Bit_reference::operator=(&local_28,true);
  }
  return;
}

Assistant:

void initialize() {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            current_velocity[dof] = 0.0;
            current_acceleration[dof] = 0.0;
            target_velocity[dof] = 0.0;
            target_acceleration[dof] = 0.0;
            max_acceleration[dof] = std::numeric_limits<double>::infinity();
            max_jerk[dof] = std::numeric_limits<double>::infinity();
            enabled[dof] = true;
        }
    }